

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.cpp
# Opt level: O2

void Imath_3_2::anon_unknown_0::rand48Next(unsigned_short *state)

{
  long lVar1;
  
  lVar1 = (ulong)*(uint6 *)state * 0x5deece66d + 0xb;
  state[2] = (unsigned_short)((ulong)lVar1 >> 0x20);
  state[1] = (unsigned_short)((ulong)lVar1 >> 0x10);
  *state = (unsigned_short)lVar1;
  return;
}

Assistant:

void
rand48Next (unsigned short state[3])
{
    //
    // drand48() and friends are all based on a linear congruential
    // sequence,
    //
    //   x[n+1] = (a * x[n] + c) % m,
    //
    // where a and c are as specified below, and m == (1 << 48)
    //

    static const uint64_t a = uint64_t (0x5deece66dLL);
    static const uint64_t c = uint64_t (0xbLL);

    //
    // Assemble the 48-bit value x[n] from the
    // three 16-bit values stored in state.
    //

    // clang-format off
    uint64_t x = (uint64_t (state[2]) << 32) |
	      (uint64_t (state[1]) << 16) |
	       uint64_t (state[0]);
    // clang-format on

    //
    // Compute x[n+1], except for the "modulo m" part.
    //

    x = a * x + c;

    //
    // Disassemble the 48 least significant bits of x[n+1] into
    // three 16-bit values.  Discard the 16 most significant bits;
    // this takes care of the "modulo m" operation.
    //
    // We assume that sizeof (unsigned short) == 2.
    //

    state[2] = (unsigned short) (x >> 32);
    state[1] = (unsigned short) (x >> 16);
    state[0] = (unsigned short) (x);
}